

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXML.cpp
# Opt level: O1

IrrXMLReaderUTF32 * irr::io::createIrrXMLReaderUTF32(FILE *file)

{
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this;
  CFileReadCallBack *this_00;
  
  this = (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)operator_new(0x88);
  this_00 = (CFileReadCallBack *)operator_new(0x18);
  (this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack =
       (_func_int **)&PTR__CFileReadCallBack_008ffa10;
  this_00->File = file;
  this_00->Size = 0;
  this_00->Close = false;
  if (file != (FILE *)0x0) {
    CFileReadCallBack::getFileSize(this_00);
  }
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::CXMLReaderImpl
            (this,(IFileReadCallBack *)this_00,true);
  return &this->super_IIrrXMLReader<unsigned_long,_irr::io::IXMLBase>;
}

Assistant:

IrrXMLReaderUTF32* createIrrXMLReaderUTF32(FILE* file)
{
	return new CXMLReaderImpl<char32, IXMLBase>(new CFileReadCallBack(file)); 
}